

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImVector<ImGuiShrinkWidthItem> *this;
  float fVar1;
  undefined1 auVar2 [16];
  ImGuiWindow_conflict *pIVar3;
  ImVec2 IVar4;
  ImGuiWindow *pIVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ImGuiTabItemFlags IVar10;
  ImGuiContext_conflict1 *pIVar11;
  ImGuiContext_conflict1 *pIVar12;
  bool bVar13;
  bool bVar14;
  ImGuiID IVar15;
  ImGuiTabItem *pIVar16;
  ImGuiTabItem *pIVar17;
  char *pcVar18;
  ImGuiShrinkWidthItem_conflict *pIVar19;
  ImGuiTabItem *pIVar20;
  byte bVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  int tab_n;
  int iVar26;
  int iVar27;
  int iVar28;
  int tab_src_n;
  int iVar29;
  uint uVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  ImGuiID local_12c;
  float local_11c;
  undefined1 local_118 [16];
  ImVec2 local_100;
  ImGuiTabBarSection sections [3];
  int shrink_buffer_indexes [3];
  ImVec2 local_a8;
  ImVec4 local_98;
  undefined8 local_80;
  ImVec2 local_78;
  ulong local_70;
  undefined1 local_68 [16];
  ImVec4 arrow_col;
  
  pIVar12 = GImGui;
  tab_bar->WantLayout = false;
  sections[1].Width = 0.0;
  sections[1].Spacing = 0.0;
  sections[2].TabCount = 0;
  sections[2].Width = 0.0;
  sections[0].TabCount = 0;
  sections[0].Width = 0.0;
  sections[0].Spacing = 0.0;
  sections[1].TabCount = 0;
  sections[2].Spacing = 0.0;
  bVar21 = 0;
  iVar26 = 0;
  for (iVar29 = 0; iVar27 = (tab_bar->Tabs).Size, iVar29 < iVar27; iVar29 = iVar29 + 1) {
    pIVar16 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar29);
    if ((pIVar16->LastFrameVisible < tab_bar->PrevFrameVisible) || (pIVar16->WantClose == true)) {
      IVar15 = pIVar16->ID;
      if (tab_bar->VisibleTabId == IVar15) {
        tab_bar->VisibleTabId = 0;
      }
      if (tab_bar->SelectedTabId == IVar15) {
        tab_bar->SelectedTabId = 0;
      }
      if (tab_bar->NextSelectedTabId == IVar15) {
        tab_bar->NextSelectedTabId = 0;
      }
    }
    else {
      if (iVar29 != iVar26) {
        pIVar16 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar29);
        pIVar17 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar26);
        IVar10 = pIVar16->Flags;
        pIVar5 = pIVar16->Window;
        iVar27 = pIVar16->LastFrameVisible;
        iVar28 = pIVar16->LastFrameSelected;
        fVar32 = pIVar16->Offset;
        fVar33 = pIVar16->Width;
        auVar2 = *(undefined1 (*) [16])((long)&pIVar16->Width + 1);
        pIVar17->ID = pIVar16->ID;
        pIVar17->Flags = IVar10;
        pIVar17->Window = pIVar5;
        pIVar17->LastFrameVisible = iVar27;
        pIVar17->LastFrameSelected = iVar28;
        pIVar17->Offset = fVar32;
        pIVar17->Width = fVar33;
        *(undefined1 (*) [16])((long)&pIVar17->Width + 1) = auVar2;
      }
      pIVar16 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar26);
      pIVar16->IndexDuringLayout = (ImS16)iVar26;
      uVar30 = pIVar16->Flags;
      lVar22 = 0;
      if ((uVar30 & 0x40) == 0) {
        lVar22 = (ulong)((char)(byte)uVar30 < '\0') + 1;
      }
      if (0 < iVar26) {
        pIVar16 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar26 + -1);
        bVar21 = (pIVar16->Flags & 0x40U) == 0 & (byte)uVar30 >> 6 | bVar21 |
                 ((uVar30 & 0xc0) != 0x80 && (pIVar16->Flags & 0xc0U) == 0x80);
      }
      sections[lVar22].TabCount = sections[lVar22].TabCount + 1;
      iVar26 = iVar26 + 1;
    }
  }
  if (iVar27 != iVar26) {
    ImVector<ImGuiTabItem>::resize(&tab_bar->Tabs,iVar26);
  }
  if (bVar21 != 0) {
    qsort((tab_bar->Tabs).Data,(long)(tab_bar->Tabs).Size,0x30,TabItemComparerBySection);
  }
  iVar26 = sections[0].TabCount;
  local_70 = (ulong)(uint)sections[1].TabCount;
  iVar29 = sections[2].TabCount;
  local_11c = 0.0;
  fVar32 = 0.0;
  if (0 < sections[1].TabCount + sections[2].TabCount && 0 < sections[0].TabCount) {
    fVar32 = (pIVar12->Style).ItemInnerSpacing.x;
  }
  sections[0].Spacing = fVar32;
  if (0 < sections[2].TabCount && 0 < sections[1].TabCount) {
    local_11c = (pIVar12->Style).ItemInnerSpacing.x;
  }
  sections[1].Spacing = local_11c;
  local_12c = tab_bar->NextSelectedTabId;
  if (local_12c != 0) {
    tab_bar->SelectedTabId = local_12c;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    bVar13 = TabBarProcessReorder(tab_bar);
    if ((bVar13) && (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)) {
      local_12c = tab_bar->ReorderRequestTabId;
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar11 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar3 = GImGui->CurrentWindow;
    fVar33 = (GImGui->Style).FramePadding.y;
    fVar35 = GImGui->FontSize;
    IVar4 = (pIVar3->DC).CursorPos;
    fVar34 = (tab_bar->BarRect).Min.y;
    (pIVar3->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar33;
    (pIVar3->DC).CursorPos.y = fVar34;
    (tab_bar->BarRect).Min.x = fVar35 + fVar33 + (tab_bar->BarRect).Min.x;
    arrow_col.x = (pIVar11->Style).Colors[0].x;
    arrow_col.y = (pIVar11->Style).Colors[0].y;
    uVar6 = (pIVar11->Style).Colors[0].z;
    uVar7 = (pIVar11->Style).Colors[0].w;
    arrow_col.w = (float)uVar7 * 0.5;
    arrow_col.z = (float)uVar6;
    iVar27 = 0;
    PushStyleColor(0,&arrow_col);
    local_98.x = 0.0;
    local_98.y = 0.0;
    local_98.z = 0.0;
    local_98.w = 0.0;
    PushStyleColor(0x15,&local_98);
    bVar13 = BeginCombo("##v",(char *)0x0,0x50);
    PopStyleColor(2);
    if (bVar13) {
      local_118._0_8_ = pIVar3;
      pIVar16 = (ImGuiTabItem *)0x0;
      local_100 = IVar4;
      for (; iVar27 < (tab_bar->Tabs).Size; iVar27 = iVar27 + 1) {
        pIVar17 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar27);
        if ((pIVar17->Flags & 0x200000) == 0) {
          pcVar18 = ImGuiTabBar::GetTabName(tab_bar,pIVar17);
          local_98.x = 0.0;
          local_98.y = 0.0;
          bVar13 = Selectable(pcVar18,tab_bar->SelectedTabId == pIVar17->ID,0,(ImVec2 *)&local_98);
          if (bVar13) {
            pIVar16 = pIVar17;
          }
        }
      }
      EndPopup();
      (pIVar3->DC).CursorPos = local_100;
      if (pIVar16 != (ImGuiTabItem *)0x0) {
        local_12c = pIVar16->ID;
        tab_bar->SelectedTabId = local_12c;
      }
    }
    else {
      (pIVar3->DC).CursorPos = IVar4;
    }
  }
  shrink_buffer_indexes[0] = 0;
  shrink_buffer_indexes[1] = iVar29 + iVar26;
  shrink_buffer_indexes[2] = iVar26;
  this = &pIVar12->ShrinkWidthBuffer;
  ImVector<ImGuiShrinkWidthItem>::resize(this,(tab_bar->Tabs).Size);
  local_100 = (ImVec2)((ulong)local_100 & 0xffffffff00000000);
  pIVar16 = (ImGuiTabItem *)0x0;
  uVar30 = 0xffffffff;
  for (iVar29 = 0; iVar27 = (tab_bar->Tabs).Size, iVar29 < iVar27; iVar29 = iVar29 + 1) {
    pIVar17 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar29);
    if (pIVar17->LastFrameVisible < tab_bar->PrevFrameVisible) {
      __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                    ,0x1ce0,"void ImGui::TabBarLayout(ImGuiTabBar *)");
    }
    if (((pIVar16 == (ImGuiTabItem *)0x0) ||
        (pIVar16->LastFrameSelected < pIVar17->LastFrameSelected)) &&
       ((pIVar17->Flags & 0x200000) == 0)) {
      pIVar16 = pIVar17;
    }
    IVar15 = pIVar17->ID;
    uVar24 = (uint)local_100.x & 0xff;
    if (IVar15 == tab_bar->SelectedTabId) {
      uVar24 = 1;
    }
    local_100.x = (float)uVar24;
    if ((local_12c == 0) && (local_12c = IVar15, pIVar12->NavJustMovedToId != IVar15)) {
      local_12c = 0;
    }
    pcVar18 = ImGuiTabBar::GetTabName(tab_bar,pIVar17);
    IVar4 = TabItemCalcSize(pcVar18,((uint)pIVar17->Flags >> 0x14 & 1) == 0);
    pIVar17->ContentWidth = IVar4.x;
    uVar24 = ((char)pIVar17->Flags < '\0') + 1;
    if ((pIVar17->Flags & 0x40U) != 0) {
      uVar24 = 0;
    }
    fVar33 = 0.0;
    if (uVar24 == uVar30) {
      fVar33 = (pIVar12->Style).ItemInnerSpacing.x;
    }
    sections[uVar24].Width = IVar4.x + fVar33 + sections[uVar24].Width;
    iVar27 = shrink_buffer_indexes[uVar24];
    shrink_buffer_indexes[uVar24] = iVar27 + 1;
    pIVar19 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar27);
    pIVar19->Index = iVar29;
    fVar33 = pIVar17->ContentWidth;
    local_118._0_4_ = fVar33;
    pIVar19 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar27);
    pIVar19->Width = fVar33;
    if (pIVar17->ContentWidth <= 0.0) {
      __assert_fail("tab->ContentWidth > 0.0f",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                    ,0x1cfb,"void ImGui::TabBarLayout(ImGuiTabBar *)");
    }
    pIVar17->Width = pIVar17->ContentWidth;
    uVar30 = uVar24;
  }
  fVar33 = 0.0;
  for (lVar22 = 8; lVar22 != 0x2c; lVar22 = lVar22 + 0xc) {
    fVar33 = fVar33 + *(float *)((long)sections + lVar22 + -4) +
                      *(float *)((long)&sections[0].TabCount + lVar22);
  }
  tab_bar->WidthAllTabsIdeal = fVar33;
  pIVar11 = GImGui;
  fVar35 = (tab_bar->BarRect).Max.x;
  if (((1 < iVar27) && (fVar35 - (tab_bar->BarRect).Min.x < fVar33)) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar3 = GImGui->CurrentWindow;
    fVar34 = GImGui->FontSize + -2.0;
    local_68 = ZEXT416((uint)fVar34);
    fVar33 = (GImGui->Style).FramePadding.y;
    local_a8.y = fVar33 + fVar33 + GImGui->FontSize;
    fVar34 = fVar34 + fVar34;
    local_118 = ZEXT416((uint)fVar34);
    local_78 = (pIVar3->DC).CursorPos;
    arrow_col.x = (GImGui->Style).Colors[0].x;
    arrow_col.y = (GImGui->Style).Colors[0].y;
    uVar8 = (GImGui->Style).Colors[0].z;
    uVar9 = (GImGui->Style).Colors[0].w;
    arrow_col.w = (float)uVar9 * 0.5;
    arrow_col.z = (float)uVar8;
    PushStyleColor(0,&arrow_col);
    local_98.x = 0.0;
    local_98.y = 0.0;
    local_98.z = 0.0;
    local_98.w = 0.0;
    PushStyleColor(0x15,&local_98);
    local_80._0_4_ = (pIVar11->IO).KeyRepeatDelay;
    local_80._4_4_ = (pIVar11->IO).KeyRepeatRate;
    (pIVar11->IO).KeyRepeatDelay = 0.25;
    (pIVar11->IO).KeyRepeatRate = 0.2;
    fVar33 = (tab_bar->BarRect).Min.x;
    fVar35 = (tab_bar->BarRect).Max.x - fVar34;
    uVar30 = -(uint)(fVar35 <= fVar33);
    fVar35 = (float)(uVar30 & (uint)fVar33 | ~uVar30 & (uint)fVar35);
    fVar33 = (tab_bar->BarRect).Min.y;
    (pIVar3->DC).CursorPos.x = fVar35;
    (pIVar3->DC).CursorPos.y = fVar33;
    local_a8.x = (float)local_68._0_4_;
    IVar4.y = local_a8.y;
    IVar4.x = (float)local_68._0_4_;
    bVar13 = ArrowButtonEx("##<",0,IVar4,0x410);
    fVar33 = (tab_bar->BarRect).Min.y;
    (pIVar3->DC).CursorPos.x = fVar35 + (float)local_68._0_4_;
    (pIVar3->DC).CursorPos.y = fVar33;
    bVar14 = ArrowButtonEx("##>",1,local_a8,0x410);
    iVar29 = -(uint)bVar13;
    if (bVar14) {
      iVar29 = 1;
    }
    PopStyleColor(2);
    (pIVar11->IO).KeyRepeatDelay = (float)(undefined4)local_80;
    (pIVar11->IO).KeyRepeatRate = (float)local_80._4_4_;
    if ((iVar29 == 0) ||
       (pIVar17 = TabBarFindTabByID(tab_bar,tab_bar->SelectedTabId), pIVar17 == (ImGuiTabItem *)0x0)
       ) {
      pIVar17 = (ImGuiTabItem *)0x0;
    }
    else {
      iVar27 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar17);
      iVar28 = iVar27 + iVar29;
      pIVar17 = (ImGuiTabItem *)0x0;
      while (pIVar17 == (ImGuiTabItem *)0x0) {
        if ((iVar28 < 0) || (iVar25 = iVar28, (tab_bar->Tabs).Size <= iVar28)) {
          iVar25 = iVar27;
        }
        pIVar20 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar25);
        pIVar17 = pIVar20;
        if ((pIVar20->Flags & 0x200000) != 0) {
          iVar27 = iVar27 + iVar29;
          iVar28 = iVar28 + iVar29;
          if ((-1 < iVar28) && (pIVar17 = (ImGuiTabItem *)0x0, (tab_bar->Tabs).Size <= iVar28)) {
            pIVar17 = pIVar20;
          }
        }
      }
    }
    (pIVar3->DC).CursorPos = local_78;
    fVar35 = (tab_bar->BarRect).Max.x - (fVar34 + 1.0);
    (tab_bar->BarRect).Max.x = fVar35;
    if ((pIVar17 != (ImGuiTabItem *)0x0) &&
       (local_12c = pIVar17->ID, (pIVar17->Flags & 0x200000) == 0)) {
      tab_bar->SelectedTabId = local_12c;
    }
  }
  fVar33 = sections[0].Width + fVar32 + sections[2].Width + 0.0;
  fVar35 = fVar35 - (tab_bar->BarRect).Min.x;
  if (fVar33 < fVar35) {
    fVar34 = (sections[1].Width + local_11c) -
             ((fVar35 - (sections[0].Width + fVar32)) - (sections[2].Width + 0.0));
    if (0.0 <= fVar34) goto LAB_001d89f2;
  }
  else {
    fVar34 = fVar33 - fVar35;
LAB_001d89f2:
    if ((0.0 < fVar34) && ((fVar35 <= fVar33 || ((tab_bar->Flags & 0x40U) != 0)))) {
      uVar30 = (uint)local_70;
      if (fVar35 <= fVar33) {
        uVar30 = sections[2].TabCount + iVar26;
      }
      uVar23 = (ulong)(uint)(sections[2].TabCount + iVar26);
      if (fVar35 <= fVar33) {
        uVar23 = 0;
      }
      iVar29 = (int)uVar23;
      ShrinkWidths((ImGuiShrinkWidthItem_conflict *)((pIVar12->ShrinkWidthBuffer).Data + iVar29),
                   uVar30,fVar34);
      while (iVar27 = (int)uVar23, iVar27 < (int)(iVar29 + uVar30)) {
        pIVar19 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar27);
        pIVar17 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,pIVar19->Index);
        pIVar19 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar27);
        if (-1 < (int)pIVar19->Width) {
          fVar33 = (float)(int)pIVar19->Width;
          uVar23 = (ulong)((char)pIVar17->Flags < '\0') + 1;
          if ((pIVar17->Flags & 0x40U) != 0) {
            uVar23 = 0;
          }
          sections[uVar23].Width = sections[uVar23].Width - (pIVar17->Width - fVar33);
          pIVar17->Width = fVar33;
        }
        uVar23 = (ulong)(iVar27 + 1);
      }
    }
  }
  tab_bar->WidthAllTabs = 0.0;
  iVar29 = 0;
  fVar33 = 0.0;
  for (lVar22 = 0; lVar22 != 3; lVar22 = lVar22 + 1) {
    local_118._0_4_ = fVar33;
    if ((lVar22 == 2) &&
       (local_118._0_4_ = ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - sections[2].Width,
       local_118._0_4_ = ~-(uint)((float)local_118._0_4_ <= 0.0) & local_118._0_4_,
       fVar33 <= (float)local_118._0_4_)) {
      local_118._0_4_ = fVar33;
    }
    iVar27 = sections[lVar22].TabCount;
    iVar28 = 0;
    iVar25 = 0;
    if (0 < iVar27) {
      iVar28 = iVar27;
      iVar25 = 0;
    }
    for (; iVar28 != iVar25; iVar25 = iVar25 + 1) {
      pIVar17 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar29 + iVar25);
      pIVar17->Offset = (float)local_118._0_4_;
      pIVar17->NameOffset = -1;
      fVar33 = 0.0;
      if (iVar25 < iVar27 + -1) {
        fVar33 = (pIVar12->Style).ItemInnerSpacing.x;
      }
      local_118._0_4_ = (float)local_118._0_4_ + fVar33 + pIVar17->Width;
    }
    fVar33 = sections[lVar22].Spacing;
    fVar35 = sections[lVar22].Width + fVar33;
    tab_bar->WidthAllTabs = (float)(-(uint)(0.0 <= fVar35) & (uint)fVar35) + tab_bar->WidthAllTabs;
    fVar33 = (float)local_118._0_4_ + fVar33;
    iVar29 = iVar27 + iVar29;
  }
  ImVector<char>::resize(&(tab_bar->TabsNames).Buf,0);
  if (((ulong)local_100 & 1) == 0) {
    tab_bar->SelectedTabId = 0;
LAB_001d8b49:
    IVar15 = 0;
    if ((tab_bar->NextSelectedTabId == 0) && (IVar15 = 0, pIVar16 != (ImGuiTabItem *)0x0)) {
      local_12c = pIVar16->ID;
      tab_bar->SelectedTabId = local_12c;
      IVar15 = local_12c;
    }
  }
  else {
    IVar15 = tab_bar->SelectedTabId;
    if (IVar15 == 0) goto LAB_001d8b49;
  }
  tab_bar->VisibleTabId = IVar15;
  tab_bar->VisibleTabWasSubmitted = false;
  pIVar3 = pIVar12->NavWindowingTarget;
  if (((pIVar3 != (ImGuiWindow_conflict *)0x0) && (pIVar3->DockNode != (ImGuiDockNode *)0x0)) &&
     (pIVar3->DockNode->TabBar == tab_bar)) {
    local_12c = pIVar3->ID;
    tab_bar->VisibleTabId = local_12c;
  }
  if (((local_12c != 0) &&
      (pIVar16 = TabBarFindTabByID(tab_bar,local_12c), pIVar16 != (ImGuiTabItem *)0x0)) &&
     ((pIVar16->Flags & 0xc0) == 0)) {
    fVar33 = GImGui->FontSize;
    iVar29 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar16);
    fVar35 = (tab_bar->BarRect).Max.x;
    fVar34 = (tab_bar->BarRect).Min.x;
    fVar31 = pIVar16->Offset - sections[0].Width;
    fVar36 = fVar33;
    if (iVar29 < iVar26) {
      fVar36 = -0.0;
    }
    fVar36 = fVar31 - fVar36;
    fVar1 = pIVar16->Width;
    if ((tab_bar->Tabs).Size - sections[2].TabCount <= iVar29 + 1) {
      fVar33 = 1.0;
    }
    tab_bar->ScrollingTargetDistToVisibility = 0.0;
    fVar33 = fVar31 + fVar1 + fVar33;
    if ((fVar36 < tab_bar->ScrollingTarget) ||
       (fVar35 = (((fVar35 - fVar34) - sections[0].Width) - sections[2].Width) - local_11c,
       fVar35 <= fVar33 - fVar36)) {
      fVar34 = tab_bar->ScrollingAnim - fVar33;
    }
    else {
      if (fVar33 - fVar35 <= tab_bar->ScrollingTarget) goto LAB_001d8d5d;
      fVar34 = (fVar36 - fVar35) - tab_bar->ScrollingAnim;
      fVar36 = fVar33 - fVar35;
    }
    tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar34) & (uint)fVar34);
    tab_bar->ScrollingTarget = fVar36;
  }
LAB_001d8d5d:
  fVar33 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingAnim);
  tab_bar->ScrollingAnim = fVar33;
  fVar35 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingTarget);
  tab_bar->ScrollingTarget = fVar35;
  if ((fVar33 != fVar35) || (NAN(fVar33) || NAN(fVar35))) {
    fVar34 = pIVar12->FontSize;
    fVar36 = fVar34 * 70.0;
    uVar30 = -(uint)(fVar36 <= tab_bar->ScrollingSpeed);
    fVar31 = ABS(fVar35 - fVar33) / 0.3;
    fVar36 = (float)(~uVar30 & (uint)fVar36 | (uint)tab_bar->ScrollingSpeed & uVar30);
    uVar30 = -(uint)(fVar31 <= fVar36);
    fVar31 = (float)(~uVar30 & (uint)fVar31 | uVar30 & (uint)fVar36);
    tab_bar->ScrollingSpeed = fVar31;
    fVar36 = fVar35;
    if ((pIVar12->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar34 * 10.0)) {
      fVar31 = fVar31 * (pIVar12->IO).DeltaTime;
      if (fVar35 <= fVar33) {
        fVar36 = fVar33;
        if (fVar35 < fVar33) {
          fVar33 = fVar33 - fVar31;
          uVar30 = -(uint)(fVar35 <= fVar33);
          fVar36 = (float)((uint)fVar33 & uVar30 | ~uVar30 & (uint)fVar35);
        }
      }
      else {
        fVar36 = fVar33 + fVar31;
        if (fVar35 <= fVar36) {
          fVar36 = fVar35;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar36;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  fVar33 = (tab_bar->BarRect).Max.x;
  tab_bar->ScrollingRectMinX = fVar32 + (tab_bar->BarRect).Min.x + sections[0].Width;
  tab_bar->ScrollingRectMaxX = (fVar33 - sections[2].Width) - local_11c;
  pIVar3 = pIVar12->CurrentWindow;
  (pIVar3->DC).CursorPos = (tab_bar->BarRect).Min;
  arrow_col.y = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
  arrow_col.x = tab_bar->WidthAllTabs;
  ItemSize((ImVec2 *)&arrow_col,(tab_bar->FramePadding).y);
  fVar33 = (tab_bar->BarRect).Min.x + tab_bar->WidthAllTabsIdeal;
  fVar32 = (pIVar3->DC).IdealMaxPos.x;
  uVar30 = -(uint)(fVar33 <= fVar32);
  (pIVar3->DC).IdealMaxPos.x = (float)(uVar30 & (uint)fVar32 | ~uVar30 & (uint)fVar33);
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = TabItemGetSectionIdx(tab);
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = TabItemGetSectionIdx(prev_tab);
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_to_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_to_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_to_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_to_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_to_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_to_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) == 0;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        int section_n = TabItemGetSectionIdx(tab);
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        IM_MSVC_WARNING_SUPPRESS(6385);
        int shrink_buffer_index = shrink_buffer_indexes[section_n]++;
        g.ShrinkWidthBuffer[shrink_buffer_index].Index = tab_n;
        g.ShrinkWidthBuffer[shrink_buffer_index].Width = tab->ContentWidth;

        IM_ASSERT(tab->ContentWidth > 0.0f);
        tab->Width = tab->ContentWidth;
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_and_select_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_to_tab_id = scroll_and_select_tab->ID;
            if ((scroll_and_select_tab->Flags & ImGuiTabItemFlags_Button) == 0)
                tab_bar->SelectedTabId = scroll_to_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess > 0.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            int section_n = TabItemGetSectionIdx(tab);
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab->NameOffset = -1;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // Clear name buffers
    tab_bar->TabsNames.Buf.resize(0);

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_to_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // CTRL+TAB can override visible tab temporarily
    if (g.NavWindowingTarget != NULL && g.NavWindowingTarget->DockNode && g.NavWindowingTarget->DockNode->TabBar == tab_bar)
        tab_bar->VisibleTabId = scroll_to_tab_id = g.NavWindowingTarget->ID;

    // Update scrolling
    if (scroll_to_tab_id != 0)
        TabBarScrollToTab(tab_bar, scroll_to_tab_id, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(ImVec2(tab_bar->WidthAllTabs, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
    window->DC.IdealMaxPos.x = ImMax(window->DC.IdealMaxPos.x, tab_bar->BarRect.Min.x + tab_bar->WidthAllTabsIdeal);
}